

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipoint-counter.cpp
# Opt level: O0

int __thiscall mahjong::MinipointCounter::total(MinipointCounter *this,bool is_round_up)

{
  bool bVar1;
  int local_2c;
  bool is_round_up_local;
  MinipointCounter *this_local;
  
  bVar1 = isNoPointsHandSelfDrawn(this);
  if (bVar1) {
    this_local._4_4_ = 0x14;
  }
  else {
    bVar1 = isSevenPairs(this);
    if (bVar1) {
      this_local._4_4_ = 0x19;
    }
    else {
      this->point = 0x14;
      computeWining(this);
      computeMelds(this);
      computePair(this);
      computeWait(this);
      computeOpenNoPointsHand(this);
      if (is_round_up) {
        local_2c = roundUp(this,this->point);
      }
      else {
        local_2c = this->point;
      }
      this_local._4_4_ = local_2c;
    }
  }
  return this_local._4_4_;
}

Assistant:

int MinipointCounter::total(bool is_round_up)
{
	if (isNoPointsHandSelfDrawn()) return 20;
	if (isSevenPairs()) return 25;

	point = 20;

	computeWining();
	computeMelds();
	computePair();
	computeWait();
	computeOpenNoPointsHand();

	return is_round_up ? roundUp(point) : point;
}